

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

Task * __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,false,false>::
malloc<depspawn::internal::TaskPool*,depspawn::internal::Workitem*&,std::_Bind<void(*(int*))(int*)>>
          (LinkedListPool<depspawn::internal::TaskPool::Task,false,false> *this,TaskPool **args,
          Workitem **args_1,_Bind<void_(*(int_*))(int_*)> *args_2)

{
  TaskPool *pTVar1;
  Workitem *pWVar2;
  Task *this_00;
  
  this_00 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)this);
  pTVar1 = *args;
  pWVar2 = *args_1;
  std::function<void()>::function<std::_Bind<void(*(int*))(int*)>,void>
            ((function<void()> *)this_00,args_2);
  this_00->ctx_ = pWVar2;
  this_00->next = (Task *)pTVar1;
  return this_00;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }